

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O2

void av1_build_inter_predictors_for_planes_single_buf
               (MACROBLOCKD *xd,BLOCK_SIZE bsize,int plane_from,int plane_to,int ref,
               uint8_t **ext_dst,int *ext_dst_stride)

{
  BLOCK_SIZE BVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int subsampling_y;
  MB_MODE_INFO *mbmi;
  qm_val_t **ppqVar5;
  long lVar6;
  undefined7 in_register_00000031;
  uint8_t *dst;
  long lVar7;
  MV mv;
  WarpTypesAllowed warp_types;
  InterPredParams local_108;
  
  mbmi = *xd->mi;
  iVar2 = xd->mi_row;
  iVar3 = xd->mi_col;
  lVar7 = (long)ref;
  warp_types.global_warp_allowed =
       is_global_mv_block(mbmi,xd->global_motion[mbmi->ref_frame[lVar7]].wmtype);
  warp_types.local_warp_allowed = (int)(mbmi->motion_mode == '\x02');
  lVar6 = (long)plane_from;
  ppqVar5 = xd->plane[lVar6 + -1].seg_qmatrix[7] + 0x11;
  for (; lVar6 <= plane_to; lVar6 = lVar6 + 1) {
    iVar4 = *(int *)((long)ppqVar5 + 0x14);
    subsampling_y = *(int *)(ppqVar5 + 3);
    BVar1 = av1_ss_size_lookup[CONCAT71(in_register_00000031,bsize) & 0xffffffff][iVar4]
            [subsampling_y];
    av1_init_inter_params
              (&local_108,(uint)block_size_wide[BVar1],(uint)block_size_high[BVar1],
               (iVar2 << 2) >> ((byte)subsampling_y & 0x1f),(iVar3 << 2) >> ((byte)iVar4 & 0x1f),
               iVar4,subsampling_y,xd->bd,(uint)xd->cur_buf->flags >> 3 & 1,0,
               xd->block_ref_scale_factors[lVar7],(buf_2d *)(ppqVar5 + lVar7 * 4 + 8),
               mbmi->interp_filters);
    iVar4 = xd->bd;
    local_108.conv_params.round_0 = iVar4 + -7;
    local_108.conv_params.round_1 = 0x15 - iVar4;
    if (iVar4 < 0xb) {
      local_108.conv_params.round_0 = 3;
      local_108.conv_params.round_1 = 0xb;
    }
    local_108.conv_params.do_average = 0;
    local_108.conv_params.dst = (CONV_BUF_TYPE *)0x0;
    local_108.conv_params.dst_stride = 0;
    local_108.conv_params.plane = (int)lVar6;
    local_108.conv_params.is_compound = 0;
    local_108.conv_params.use_dist_wtd_comp_avg = 0;
    av1_init_warp_params(&local_108,&warp_types,ref,xd,mbmi);
    dst = (uint8_t *)((ulong)ext_dst[lVar6] >> 1);
    if ((xd->cur_buf->flags & 8) == 0) {
      dst = ext_dst[lVar6];
    }
    mv = *(MV *)(mbmi->mv + lVar7);
    build_one_inter_predictor(dst,ext_dst_stride[lVar6],&mv,&local_108);
    ppqVar5 = ppqVar5 + 0x146;
  }
  return;
}

Assistant:

void av1_build_inter_predictors_for_planes_single_buf(
    MACROBLOCKD *xd, BLOCK_SIZE bsize, int plane_from, int plane_to, int ref,
    uint8_t *ext_dst[], int ext_dst_stride[]) {
  assert(bsize < BLOCK_SIZES_ALL);
  const MB_MODE_INFO *mi = xd->mi[0];
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;
  const int mi_x = mi_col * MI_SIZE;
  const int mi_y = mi_row * MI_SIZE;
  WarpTypesAllowed warp_types;
  const WarpedMotionParams *const wm = &xd->global_motion[mi->ref_frame[ref]];
  warp_types.global_warp_allowed = is_global_mv_block(mi, wm->wmtype);
  warp_types.local_warp_allowed = mi->motion_mode == WARPED_CAUSAL;

  for (int plane = plane_from; plane <= plane_to; ++plane) {
    const struct macroblockd_plane *pd = &xd->plane[plane];
    const BLOCK_SIZE plane_bsize =
        get_plane_block_size(bsize, pd->subsampling_x, pd->subsampling_y);
    const int bw = block_size_wide[plane_bsize];
    const int bh = block_size_high[plane_bsize];

    InterPredParams inter_pred_params;

    av1_init_inter_params(&inter_pred_params, bw, bh, mi_y >> pd->subsampling_y,
                          mi_x >> pd->subsampling_x, pd->subsampling_x,
                          pd->subsampling_y, xd->bd, is_cur_buf_hbd(xd), 0,
                          xd->block_ref_scale_factors[ref], &pd->pre[ref],
                          mi->interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, plane, xd->bd);
    av1_init_warp_params(&inter_pred_params, &warp_types, ref, xd, mi);

    uint8_t *const dst = get_buf_by_bd(xd, ext_dst[plane]);
    const MV mv = mi->mv[ref].as_mv;

    av1_enc_build_one_inter_predictor(dst, ext_dst_stride[plane], &mv,
                                      &inter_pred_params);
  }
}